

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext_p.h
# Opt level: O1

QOpenGLContext *
QEGLPlatformContext::createFrom<QXcbEglContext>
          (EGLContext context,EGLDisplay contextDisplay,EGLDisplay platformDisplay,
          QOpenGLContext *shareContext)

{
  QPlatformOpenGLContext *pQVar1;
  QOpenGLContext *this;
  QEGLPlatformContext *this_00;
  
  if (context != (EGLContext)0x0) {
    if (contextDisplay == platformDisplay) {
      if (shareContext != (QOpenGLContext *)0x0) {
        QOpenGLContext::handle();
      }
      this = (QOpenGLContext *)operator_new(0x10);
      QOpenGLContext::QOpenGLContext(this,(QObject *)0x0);
      pQVar1 = *(QPlatformOpenGLContext **)(this + 8);
      this_00 = (QEGLPlatformContext *)operator_new(0x78);
      QEGLPlatformContext(this_00);
      *(undefined ***)this_00 = &PTR__QEGLPlatformContext_0010d230;
      *(undefined ***)(this_00 + 0x10) = &PTR__QXcbEglContext_0010d2e8;
      ::QEGLPlatformContext::adopt(this_00,context,(QPlatformOpenGLContext *)contextDisplay);
      QOpenGLContextPrivate::adopt(pQVar1);
      return this;
    }
    createFrom<QXcbEglContext>();
  }
  return (QOpenGLContext *)0x0;
}

Assistant:

static QOpenGLContext *createFrom(EGLContext context, EGLDisplay contextDisplay,
            EGLDisplay platformDisplay, QOpenGLContext *shareContext)
    {
        if (!context)
            return nullptr;

        // A context belonging to a given EGLDisplay cannot be used with another one
        if (contextDisplay != platformDisplay) {
            qWarning("QEGLPlatformContext: Cannot adopt context from different display");
            return nullptr;
        }

        QPlatformOpenGLContext *shareHandle = shareContext ? shareContext->handle() : nullptr;

        auto *resultingContext = new QOpenGLContext;
        auto *contextPrivate = QOpenGLContextPrivate::get(resultingContext);
        auto *platformContext = new T;
        platformContext->adopt(context, contextDisplay, shareHandle);
        contextPrivate->adopt(platformContext);
        return resultingContext;
    }